

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeRename(sqlite3_vtab *pVtab,char *zNewName)

{
  sqlite3_blob *pBlob;
  int iVar1;
  char *zSql;
  
  zSql = sqlite3_mprintf(
                        "ALTER TABLE %Q.\'%q_node\'   RENAME TO \"%w_node\";ALTER TABLE %Q.\'%q_parent\' RENAME TO \"%w_parent\";ALTER TABLE %Q.\'%q_rowid\'  RENAME TO \"%w_rowid\";"
                        );
  if (zSql == (char *)0x0) {
    iVar1 = 7;
  }
  else {
    pBlob = (sqlite3_blob *)pVtab[4].zErrMsg;
    pVtab[4].zErrMsg = (char *)0x0;
    sqlite3_blob_close(pBlob);
    iVar1 = sqlite3_exec((sqlite3 *)pVtab[1].pModule,zSql,(sqlite3_callback)0x0,(void *)0x0,
                         (char **)0x0);
    sqlite3_free(zSql);
  }
  return iVar1;
}

Assistant:

static int rtreeRename(sqlite3_vtab *pVtab, const char *zNewName){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_NOMEM;
  char *zSql = sqlite3_mprintf(
    "ALTER TABLE %Q.'%q_node'   RENAME TO \"%w_node\";"
    "ALTER TABLE %Q.'%q_parent' RENAME TO \"%w_parent\";"
    "ALTER TABLE %Q.'%q_rowid'  RENAME TO \"%w_rowid\";"
    , pRtree->zDb, pRtree->zName, zNewName
    , pRtree->zDb, pRtree->zName, zNewName
    , pRtree->zDb, pRtree->zName, zNewName
  );
  if( zSql ){
    nodeBlobReset(pRtree);
    rc = sqlite3_exec(pRtree->db, zSql, 0, 0, 0);
    sqlite3_free(zSql);
  }
  return rc;
}